

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMDataProviders.cpp
# Opt level: O2

void __thiscall
ASDCP::SilenceDataProvider::SilenceDataProvider
          (SilenceDataProvider *this,ui16_t numChannels,ui16_t bitsPerSample,ui32_t sampleRate,
          Rational *editRate)

{
  uint uVar1;
  ui32_t uVar2;
  undefined2 in_register_00000012;
  undefined2 in_register_00000032;
  
  (this->super_PCMDataProviderInterface)._vptr_PCMDataProviderInterface =
       (_func_int **)&PTR__SilenceDataProvider_0021a788;
  uVar1 = CONCAT22(in_register_00000012,bitsPerSample) + 7U >> 3;
  (this->m_ADesc).EditRate.Numerator = 0;
  (this->m_ADesc).EditRate.Denominator = 0;
  (this->m_ADesc).AudioSamplingRate.Numerator = 0;
  (this->m_ADesc).AudioSamplingRate.Denominator = 0;
  (this->m_ADesc).Locked = 0;
  (this->m_ADesc).ChannelCount = 0;
  (this->m_ADesc).QuantizationBits = 0;
  (this->m_ADesc).BlockAlign = 0;
  (this->m_ADesc).AvgBps = 0;
  (this->m_ADesc).LinkedTrackID = 0;
  (this->m_ADesc).ContainerDuration = 0;
  (this->m_ADesc).ChannelFormat = CF_NONE;
  this->m_SampleSize = uVar1;
  (this->m_ADesc).EditRate = *editRate;
  (this->m_ADesc).AudioSamplingRate = (Rational)((ulong)sampleRate | 0x100000000);
  (this->m_ADesc).ChannelCount = CONCAT22(in_register_00000032,numChannels);
  (this->m_ADesc).QuantizationBits = CONCAT22(in_register_00000012,bitsPerSample);
  uVar2 = uVar1 * CONCAT22(in_register_00000032,numChannels);
  (this->m_ADesc).BlockAlign = uVar2;
  (this->m_ADesc).AvgBps = uVar2 * sampleRate;
  return;
}

Assistant:

ASDCP::SilenceDataProvider::SilenceDataProvider(const ui16_t numChannels, const ui16_t bitsPerSample,
                                                const ui32_t sampleRate, const ASDCP::Rational& editRate)
    : m_ADesc(), m_SampleSize(0)
{
    m_SampleSize = ((bitsPerSample + 7) / 8);
    m_ADesc.EditRate = editRate;
    m_ADesc.AudioSamplingRate = Rational(sampleRate, 1);
    m_ADesc.ChannelCount = numChannels;
    m_ADesc.QuantizationBits = bitsPerSample;
    m_ADesc.BlockAlign = numChannels * m_SampleSize;
    m_ADesc.AvgBps = sampleRate * m_ADesc.BlockAlign;
}